

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSSetJacEvalFrequency(void *arkode_mem,long msbj)

{
  int iVar1;
  long lVar2;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacEvalFrequency",&local_10,&local_18);
  if (iVar1 == 0) {
    lVar2 = 0x33;
    if (0 < msbj) {
      lVar2 = msbj;
    }
    local_18->msbj = lVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSSetJacEvalFrequency(void *arkode_mem, long int msbj)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacEvalFrequency",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->msbj = (msbj <= ZERO) ? ARKLS_MSBJ : msbj;

  return(ARKLS_SUCCESS);
}